

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::precisionReached(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *newpricertol)

{
  type_conflict5 tVar1;
  SPxOut *pSVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolRedCost;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolRedCost;
  Verbosity old_verbosity;
  double local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3d8;
  uint local_398 [6];
  undefined5 uStack_380;
  undefined3 uStack_37b;
  undefined5 local_378;
  undefined3 uStack_373;
  int local_370;
  undefined1 local_36c;
  undefined8 local_368;
  uint local_358 [6];
  undefined5 uStack_340;
  undefined3 uStack_33b;
  undefined5 local_338;
  undefined3 uStack_333;
  int local_330;
  undefined1 local_32c;
  undefined8 local_328;
  uint local_318 [6];
  undefined5 uStack_300;
  undefined3 uStack_2fb;
  undefined5 local_2f8;
  undefined3 uStack_2f3;
  int local_2f0;
  undefined1 local_2ec;
  undefined8 local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  cpp_dec_float<50U,_int,_void> local_298;
  cpp_dec_float<50U,_int,_void> local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_2d8.m_backend.fpclass = cpp_dec_float_finite;
  local_2d8.m_backend.prec_elem = 10;
  local_2d8.m_backend.data._M_elems[0] = 0;
  local_2d8.m_backend.data._M_elems[1] = 0;
  local_2d8.m_backend.data._M_elems[2] = 0;
  local_2d8.m_backend.data._M_elems[3] = 0;
  local_2d8.m_backend.data._M_elems[4] = 0;
  local_2d8.m_backend.data._M_elems[5] = 0;
  local_2d8.m_backend.data._M_elems._24_5_ = 0;
  local_2d8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_2d8.m_backend.data._M_elems._32_5_ = 0;
  local_2d8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_2d8.m_backend.exp = 0;
  local_2d8.m_backend.neg = false;
  local_2e8._0_4_ = cpp_dec_float_finite;
  local_2e8._4_4_ = 10;
  local_318[0] = 0;
  local_318[1] = 0;
  local_318[2] = 0;
  local_318[3] = 0;
  local_318[4] = 0;
  local_318[5] = 0;
  uStack_300 = 0;
  uStack_2fb = 0;
  local_2f8 = 0;
  uStack_2f3 = 0;
  local_2f0 = 0;
  local_2ec = 0;
  local_3d8.m_backend.fpclass = cpp_dec_float_finite;
  local_3d8.m_backend.prec_elem = 10;
  local_3d8.m_backend.data._M_elems[0] = 0;
  local_3d8.m_backend.data._M_elems[1] = 0;
  local_3d8.m_backend.data._M_elems[2] = 0;
  local_3d8.m_backend.data._M_elems[3] = 0;
  local_3d8.m_backend.data._M_elems[4] = 0;
  local_3d8.m_backend.data._M_elems[5] = 0;
  local_3d8.m_backend.data._M_elems._24_5_ = 0;
  local_3d8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_3d8.m_backend.data._M_elems._32_5_ = 0;
  local_3d8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_3d8.m_backend.exp = 0;
  local_3d8.m_backend.neg = false;
  local_328._0_4_ = cpp_dec_float_finite;
  local_328._4_4_ = 10;
  local_358[0] = 0;
  local_358[1] = 0;
  local_358[2] = 0;
  local_358[3] = 0;
  local_358[4] = 0;
  local_358[5] = 0;
  uStack_340 = 0;
  uStack_33b = 0;
  local_338 = 0;
  uStack_333 = 0;
  local_330 = 0;
  local_32c = 0;
  local_418.m_backend.fpclass = cpp_dec_float_finite;
  local_418.m_backend.prec_elem = 10;
  local_418.m_backend.data._M_elems[0] = 0;
  local_418.m_backend.data._M_elems[1] = 0;
  local_418.m_backend.data._M_elems[2] = 0;
  local_418.m_backend.data._M_elems[3] = 0;
  local_418.m_backend.data._M_elems[4] = 0;
  local_418.m_backend.data._M_elems[5] = 0;
  local_418.m_backend.data._M_elems._24_5_ = 0;
  local_418.m_backend.data._M_elems[7]._1_3_ = 0;
  local_418.m_backend.data._M_elems._32_5_ = 0;
  local_418.m_backend.data._M_elems[9]._1_3_ = 0;
  local_418.m_backend.exp = 0;
  local_418.m_backend.neg = false;
  local_368._0_4_ = cpp_dec_float_finite;
  local_368._4_4_ = 10;
  local_398[0] = 0;
  local_398[1] = 0;
  local_398[2] = 0;
  local_398[3] = 0;
  local_398[4] = 0;
  local_398[5] = 0;
  uStack_380 = 0;
  uStack_37b = 0;
  local_378 = 0;
  uStack_373 = 0;
  local_370 = 0;
  local_36c = 0;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x72])(this,&local_2d8);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x70])(this,&local_3d8,local_358);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6f])(this,&local_418,local_398);
  local_298.data._M_elems._0_8_ =
       Tolerances::floatingPointOpttol
                 ((this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  tVar1 = boost::multiprecision::operator<(&local_2d8,(double *)&local_298);
  if (tVar1) {
    local_260.data._M_elems._0_8_ =
         Tolerances::floatingPointFeastol
                   ((this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    tVar1 = boost::multiprecision::operator<(&local_3d8,(double *)&local_260);
    if (tVar1) {
      local_420 = Tolerances::floatingPointFeastol
                            ((this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
      tVar1 = boost::multiprecision::operator<(&local_418,&local_420);
      if (tVar1) {
        return true;
      }
    }
  }
  (*this->thepricer->_vptr_SPxPricer[5])(&local_260);
  local_420 = 10.0;
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems[6] = 0;
  local_298.data._M_elems[7] = 0;
  local_298.data._M_elems._32_5_ = 0;
  local_298.data._M_elems[9]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&local_298,&local_260,&local_420);
  *(ulong *)((newpricertol->m_backend).data._M_elems + 8) =
       CONCAT35(local_298.data._M_elems[9]._1_3_,local_298.data._M_elems._32_5_);
  (newpricertol->m_backend).data._M_elems[4] = local_298.data._M_elems[4];
  (newpricertol->m_backend).data._M_elems[5] = local_298.data._M_elems[5];
  (newpricertol->m_backend).data._M_elems[6] = local_298.data._M_elems[6];
  (newpricertol->m_backend).data._M_elems[7] = local_298.data._M_elems[7];
  (newpricertol->m_backend).data._M_elems[0] = local_298.data._M_elems[0];
  (newpricertol->m_backend).data._M_elems[1] = local_298.data._M_elems[1];
  (newpricertol->m_backend).data._M_elems[2] = local_298.data._M_elems[2];
  (newpricertol->m_backend).data._M_elems[3] = local_298.data._M_elems[3];
  (newpricertol->m_backend).exp = local_298.exp;
  (newpricertol->m_backend).neg = local_298.neg;
  (newpricertol->m_backend).fpclass = local_298.fpclass;
  (newpricertol->m_backend).prec_elem = local_298.prec_elem;
  pSVar2 = this->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_298.data._M_elems[0] = pSVar2->m_verbosity;
    local_260.data._M_elems[0] = 5;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<(this->spxout,"Precision not reached: Pricer tolerance = ");
    (*this->thepricer->_vptr_SPxPricer[5])(&local_68);
    pSVar2 = soplex::operator<<(pSVar2,&local_68);
    pSVar2 = soplex::operator<<(pSVar2," new tolerance = ");
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newpricertol->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (newpricertol->m_backend).exp;
    local_a8.m_backend.neg = (newpricertol->m_backend).neg;
    local_a8.m_backend.fpclass = (newpricertol->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (newpricertol->m_backend).prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_a8);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = soplex::operator<<(pSVar2," maxViolRedCost= ");
    local_e8.m_backend.data._M_elems[7]._1_3_ = local_2d8.m_backend.data._M_elems[7]._1_3_;
    local_e8.m_backend.data._M_elems._24_5_ = local_2d8.m_backend.data._M_elems._24_5_;
    local_e8.m_backend.data._M_elems[0] = local_2d8.m_backend.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = local_2d8.m_backend.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = local_2d8.m_backend.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = local_2d8.m_backend.data._M_elems[3];
    local_e8.m_backend.data._M_elems[4] = local_2d8.m_backend.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = local_2d8.m_backend.data._M_elems[5];
    local_e8.m_backend.data._M_elems[9]._1_3_ = local_2d8.m_backend.data._M_elems[9]._1_3_;
    local_e8.m_backend.data._M_elems._32_5_ = local_2d8.m_backend.data._M_elems._32_5_;
    local_e8.m_backend.exp = local_2d8.m_backend.exp;
    local_e8.m_backend.neg = local_2d8.m_backend.neg;
    local_e8.m_backend.fpclass = local_2d8.m_backend.fpclass;
    local_e8.m_backend.prec_elem = local_2d8.m_backend.prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_e8);
    pSVar2 = soplex::operator<<(pSVar2," maxViolBounds= ");
    local_128.m_backend.data._M_elems[7]._1_3_ = local_3d8.m_backend.data._M_elems[7]._1_3_;
    local_128.m_backend.data._M_elems._24_5_ = local_3d8.m_backend.data._M_elems._24_5_;
    local_128.m_backend.data._M_elems[0] = local_3d8.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_3d8.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_3d8.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_3d8.m_backend.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_3d8.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_3d8.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[9]._1_3_ = local_3d8.m_backend.data._M_elems[9]._1_3_;
    local_128.m_backend.data._M_elems._32_5_ = local_3d8.m_backend.data._M_elems._32_5_;
    local_128.m_backend.exp = local_3d8.m_backend.exp;
    local_128.m_backend.neg = local_3d8.m_backend.neg;
    local_128.m_backend.fpclass = local_3d8.m_backend.fpclass;
    local_128.m_backend.prec_elem = local_3d8.m_backend.prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_128);
    pSVar2 = soplex::operator<<(pSVar2," maxViolConst= ");
    local_168.m_backend.data._M_elems[7]._1_3_ = local_418.m_backend.data._M_elems[7]._1_3_;
    local_168.m_backend.data._M_elems._24_5_ = local_418.m_backend.data._M_elems._24_5_;
    local_168.m_backend.data._M_elems[0] = local_418.m_backend.data._M_elems[0];
    local_168.m_backend.data._M_elems[1] = local_418.m_backend.data._M_elems[1];
    local_168.m_backend.data._M_elems[2] = local_418.m_backend.data._M_elems[2];
    local_168.m_backend.data._M_elems[3] = local_418.m_backend.data._M_elems[3];
    local_168.m_backend.data._M_elems[4] = local_418.m_backend.data._M_elems[4];
    local_168.m_backend.data._M_elems[5] = local_418.m_backend.data._M_elems[5];
    local_168.m_backend.data._M_elems[9]._1_3_ = local_418.m_backend.data._M_elems[9]._1_3_;
    local_168.m_backend.data._M_elems._32_5_ = local_418.m_backend.data._M_elems._32_5_;
    local_168.m_backend.exp = local_418.m_backend.exp;
    local_168.m_backend.neg = local_418.m_backend.neg;
    local_168.m_backend.fpclass = local_418.m_backend.fpclass;
    local_168.m_backend.prec_elem = local_418.m_backend.prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_168);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = soplex::operator<<(pSVar2," sumViolRedCost= ");
    local_1a8.m_backend.data._M_elems[7]._1_3_ = uStack_2fb;
    local_1a8.m_backend.data._M_elems._24_5_ = uStack_300;
    local_1a8.m_backend.data._M_elems[0] = local_318[0];
    local_1a8.m_backend.data._M_elems[1] = local_318[1];
    local_1a8.m_backend.data._M_elems[2] = local_318[2];
    local_1a8.m_backend.data._M_elems[3] = local_318[3];
    local_1a8.m_backend.data._M_elems[4] = local_318[4];
    local_1a8.m_backend.data._M_elems[5] = local_318[5];
    local_1a8.m_backend.data._M_elems[9]._1_3_ = uStack_2f3;
    local_1a8.m_backend.data._M_elems._32_5_ = local_2f8;
    local_1a8.m_backend.exp = local_2f0;
    local_1a8.m_backend.neg = (bool)local_2ec;
    local_1a8.m_backend.fpclass = (fpclass_type)local_2e8;
    local_1a8.m_backend.prec_elem = local_2e8._4_4_;
    pSVar2 = soplex::operator<<(pSVar2,&local_1a8);
    pSVar2 = soplex::operator<<(pSVar2," sumViolBounds= ");
    local_1e8.m_backend.data._M_elems[7]._1_3_ = uStack_33b;
    local_1e8.m_backend.data._M_elems._24_5_ = uStack_340;
    local_1e8.m_backend.data._M_elems[0] = local_358[0];
    local_1e8.m_backend.data._M_elems[1] = local_358[1];
    local_1e8.m_backend.data._M_elems[2] = local_358[2];
    local_1e8.m_backend.data._M_elems[3] = local_358[3];
    local_1e8.m_backend.data._M_elems[4] = local_358[4];
    local_1e8.m_backend.data._M_elems[5] = local_358[5];
    local_1e8.m_backend.data._M_elems[9]._1_3_ = uStack_333;
    local_1e8.m_backend.data._M_elems._32_5_ = local_338;
    local_1e8.m_backend.exp = local_330;
    local_1e8.m_backend.neg = (bool)local_32c;
    local_1e8.m_backend.fpclass = (fpclass_type)local_328;
    local_1e8.m_backend.prec_elem = local_328._4_4_;
    pSVar2 = soplex::operator<<(pSVar2,&local_1e8);
    pSVar2 = soplex::operator<<(pSVar2," sumViolConst= ");
    local_228.m_backend.data._M_elems[7]._1_3_ = uStack_37b;
    local_228.m_backend.data._M_elems._24_5_ = uStack_380;
    local_228.m_backend.data._M_elems[0] = local_398[0];
    local_228.m_backend.data._M_elems[1] = local_398[1];
    local_228.m_backend.data._M_elems[2] = local_398[2];
    local_228.m_backend.data._M_elems[3] = local_398[3];
    local_228.m_backend.data._M_elems[4] = local_398[4];
    local_228.m_backend.data._M_elems[5] = local_398[5];
    local_228.m_backend.data._M_elems[9]._1_3_ = uStack_373;
    local_228.m_backend.data._M_elems._32_5_ = local_378;
    local_228.m_backend.exp = local_370;
    local_228.m_backend.neg = (bool)local_36c;
    local_228.m_backend.fpclass = (fpclass_type)local_368;
    local_228.m_backend.prec_elem = local_368._4_4_;
    pSVar2 = soplex::operator<<(pSVar2,&local_228);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_298);
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}